

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O1

void __thiscall
CompressedArray::find_best_radix_parameters
          (CompressedArray *this,vector<Record,_std::allocator<Record>_> *records)

{
  long lVar1;
  pointer pRVar2;
  byte bVar3;
  uint uVar4;
  uint32_t uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  pointer pRVar11;
  byte bVar12;
  uint32_t j;
  undefined8 *puVar13;
  long lVar14;
  uint32_t uVar15;
  ulong uVar16;
  uint uVar17;
  uint32_t uVar18;
  ulong uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  int iVar22;
  char cVar23;
  
  puVar6 = (undefined8 *)operator_new(0x40);
  *puVar6 = 0;
  puVar6[1] = 0;
  puVar6[2] = 0;
  puVar6[3] = 0;
  puVar6[4] = 0;
  puVar6[5] = 0;
  puVar6[6] = 0;
  puVar6[7] = 0;
  puVar7 = (undefined8 *)operator_new(0x40);
  puVar7[6] = 0;
  puVar7[7] = 0;
  puVar7[4] = 0;
  puVar7[5] = 0;
  puVar7[2] = 0;
  puVar7[3] = 0;
  *puVar7 = 0;
  puVar7[1] = 0;
  puVar8 = (undefined8 *)operator_new(0x40);
  puVar8[6] = 0;
  puVar8[7] = 0;
  puVar8[4] = 0;
  puVar8[5] = 0;
  puVar8[2] = 0;
  puVar8[3] = 0;
  *puVar8 = 0;
  puVar8[1] = 0;
  puVar9 = (undefined8 *)operator_new(0x40);
  puVar9[6] = 0;
  puVar9[7] = 0;
  puVar9[4] = 0;
  puVar9[5] = 0;
  puVar9[2] = 0;
  puVar9[3] = 0;
  *puVar9 = 0;
  puVar9[1] = 0;
  puVar10 = (undefined8 *)operator_new(0x40);
  puVar10[6] = 0;
  puVar10[7] = 0;
  puVar10[4] = 0;
  puVar10[5] = 0;
  puVar10[2] = 0;
  puVar10[3] = 0;
  *puVar10 = 0;
  puVar10[1] = 0;
  pRVar11 = (records->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(records->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pRVar11 >> 2) *
                 -0x3333333333333333)) {
    uVar19 = 1;
    do {
      pRVar2 = pRVar11 + uVar19;
      uVar17 = 0xffffffff;
      iVar22 = 2;
      cVar23 = '\x01';
      lVar14 = 0;
      do {
        uVar4 = uVar17;
        if (pRVar2[-1].key.word_index == (pRVar2->key).word_index) {
          bVar12 = 0;
          do {
            bVar3 = bVar12 & 0x3f;
            uVar4 = uVar4 + iVar22;
            bVar12 = bVar12 + cVar23;
            puVar13 = puVar6;
          } while ((pRVar2->key).context_index - pRVar2[-1].key.context_index >> bVar3 != 0);
        }
        else {
          bVar12 = 0;
          do {
            bVar3 = bVar12 & 0x3f;
            uVar4 = uVar4 + iVar22;
            bVar12 = bVar12 + cVar23;
            puVar13 = puVar7;
          } while ((pRVar2->key).context_index >> bVar3 != 0);
        }
        puVar13[lVar14] = puVar13[lVar14] + (ulong)uVar4;
        uVar5 = Vocabulary<unsigned_int>::get_index
                          (&this->ngram_count_values,&pRVar11[uVar19].value.ngram_count);
        lVar1 = lVar14 + 1;
        bVar12 = 0;
        uVar16 = (ulong)uVar17;
        do {
          bVar3 = bVar12 & 0x3f;
          uVar16 = (ulong)(uint)((int)uVar16 + iVar22);
          bVar12 = bVar12 + cVar23;
        } while (uVar5 >> bVar3 != 0);
        puVar8[lVar14] = puVar8[lVar14] + uVar16;
        uVar5 = Vocabulary<unsigned_int>::get_index
                          (&this->continuations_count_values,
                           &pRVar11[uVar19].value.continuations_count);
        bVar12 = 0;
        uVar16 = (ulong)uVar17;
        do {
          bVar3 = bVar12 & 0x3f;
          uVar16 = (ulong)(uint)((int)uVar16 + iVar22);
          bVar12 = bVar12 + cVar23;
        } while (uVar5 >> bVar3 != 0);
        puVar9[lVar14] = puVar9[lVar14] + uVar16;
        uVar5 = Vocabulary<unsigned_int>::get_index
                          (&this->unique_continuations_count_values,
                           &pRVar11[uVar19].value.unique_continuations_count);
        bVar12 = 0;
        uVar16 = (ulong)uVar17;
        do {
          bVar3 = bVar12 & 0x3f;
          uVar16 = (ulong)(uint)((int)uVar16 + iVar22);
          bVar12 = bVar12 + cVar23;
        } while (uVar5 >> bVar3 != 0);
        puVar10[lVar14] = puVar10[lVar14] + uVar16;
        uVar17 = uVar17 - 1;
        iVar22 = iVar22 + 1;
        cVar23 = cVar23 + '\x01';
        lVar14 = lVar1;
      } while (lVar1 != 8);
      uVar19 = uVar19 + 1;
      pRVar11 = (records->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar19 < (ulong)(((long)(records->super__Vector_base<Record,_std::allocator<Record>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pRVar11 >> 2)
                             * -0x3333333333333333));
  }
  this->word_index_diff_log_radix = 2;
  this->context_index_diff_log_radix = 1;
  this->context_index_log_radix = 1;
  this->ngram_count_index_log_radix = 1;
  this->continuations_count_index_log_radix = 1;
  this->unique_continuations_count_index_log_radix = 1;
  uVar5 = this->context_index_diff_log_radix;
  uVar15 = this->context_index_log_radix;
  uVar18 = this->ngram_count_index_log_radix;
  uVar21 = 1;
  lVar14 = 0;
  uVar20 = 1;
  do {
    iVar22 = (int)lVar14;
    if ((ulong)puVar6[lVar14] < (ulong)puVar6[uVar5 - 1]) {
      uVar5 = iVar22 + 1;
      this->context_index_diff_log_radix = uVar5;
    }
    if ((ulong)puVar7[lVar14] < (ulong)puVar7[uVar15 - 1]) {
      uVar15 = iVar22 + 1;
      this->context_index_log_radix = uVar15;
    }
    if ((ulong)puVar8[lVar14] < (ulong)puVar8[uVar18 - 1]) {
      uVar18 = iVar22 + 1;
      this->ngram_count_index_log_radix = uVar18;
    }
    if ((ulong)puVar9[lVar14] < (ulong)puVar9[uVar21 - 1]) {
      uVar21 = iVar22 + 1;
      this->continuations_count_index_log_radix = uVar21;
    }
    if ((ulong)puVar10[lVar14] < (ulong)puVar10[uVar20 - 1]) {
      uVar20 = iVar22 + 1;
      this->unique_continuations_count_index_log_radix = uVar20;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 8);
  operator_delete(puVar10);
  operator_delete(puVar9);
  operator_delete(puVar8);
  operator_delete(puVar7);
  operator_delete(puVar6);
  return;
}

Assistant:

void CompressedArray::find_best_radix_parameters(const vector<Record>& records) {
    vector<uint64_t> context_index_diff_size(8, 0);
    vector<uint64_t> context_index_size(8, 0);
    vector<uint64_t> ngram_count_index_size(8, 0);
    vector<uint64_t> continuations_count_index_size(8, 0);
    vector<uint64_t> unique_continuations_count_index_size(8, 0);

    for (size_t i = 1; i < records.size(); i++) {
        const Record& record = records[i];
        const Record& prev_record = records[i - 1];

        for (uint32_t j = 0; j < 8; j++) {
            if (prev_record.key.word_index == record.key.word_index) {
                uint32_t diff = record.key.context_index - prev_record.key.context_index;
                context_index_diff_size[j] += calculate_number_size(diff, j + 1);
            } else {
                context_index_size[j] += calculate_number_size(record.key.context_index, j + 1);
            }

            uint32_t index = ngram_count_values.get_index(record.value.ngram_count);
            ngram_count_index_size[j] += calculate_number_size(index, j + 1);
            index = continuations_count_values.get_index(record.value.continuations_count);
            continuations_count_index_size[j] += calculate_number_size(index, j + 1);
            index = unique_continuations_count_values.get_index(record.value.unique_continuations_count);
            unique_continuations_count_index_size[j] += calculate_number_size(index, j + 1);
        }
    }

    word_index_diff_log_radix = 2;
    context_index_diff_log_radix = 1;
    context_index_log_radix = 1;
    ngram_count_index_log_radix = 1;
    continuations_count_index_log_radix = 1;
    unique_continuations_count_index_log_radix = 1;
    for (uint32_t j = 0; j < 8; j++) {
        if (context_index_diff_size[context_index_diff_log_radix - 1] >
                context_index_diff_size[j])
            context_index_diff_log_radix = j + 1;
        if (context_index_size[context_index_log_radix - 1] >
                context_index_size[j])
            context_index_log_radix = j + 1;
        if (ngram_count_index_size[ngram_count_index_log_radix - 1] >
                ngram_count_index_size[j])
            ngram_count_index_log_radix = j + 1;
        if (continuations_count_index_size[continuations_count_index_log_radix - 1] >
                continuations_count_index_size[j])
            continuations_count_index_log_radix = j + 1;
        if (unique_continuations_count_index_size[unique_continuations_count_index_log_radix - 1] >
                unique_continuations_count_index_size[j])
            unique_continuations_count_index_log_radix = j + 1;
    }
}